

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

bool __thiscall S2Loop::Contains(S2Loop *this,S2Cell *target)

{
  bool bVar1;
  CellRelation CVar2;
  const_iterator cVar3;
  Iterator local_78;
  S2Point local_38;
  
  local_78.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
  local_78.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_78.super_IteratorBase._vptr_IteratorBase = (_func_int **)&PTR__IteratorBase_002c10d0;
  local_78.iter_.node =
       (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
        *)0x0;
  local_78.iter_.position = -1;
  local_78.end_.node =
       (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
        *)0x0;
  local_78.end_.position = -1;
  if ((this->index_).index_status_._M_i != FRESH) {
    MutableS2ShapeIndex::ApplyUpdatesThreadSafe(&this->index_);
  }
  local_78.index_ = &this->index_;
  cVar3 = gtl::internal_btree::
          btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                 *)&(this->index_).cell_map_);
  local_78.iter_.node = cVar3.node;
  local_78.iter_.position = cVar3.position;
  local_78.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
  local_78.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_78.end_.node = local_78.iter_.node;
  local_78.end_.position = local_78.iter_.position;
  CVar2 = MutableS2ShapeIndex::Iterator::Locate(&local_78,(S2CellId)(target->id_).id_);
  if ((CVar2 != INDEXED) || (bVar1 = BoundaryApproxIntersects(this,&local_78,target), bVar1)) {
    bVar1 = false;
  }
  else {
    S2Cell::GetCenter(&local_38,target);
    bVar1 = Contains(this,&local_78,&local_38);
  }
  return bVar1;
}

Assistant:

bool S2Loop::Contains(const S2Cell& target) const {
  MutableS2ShapeIndex::Iterator it(&index_);
  S2ShapeIndex::CellRelation relation = it.Locate(target.id());

  // If "target" is disjoint from all index cells, it is not contained.
  // Similarly, if "target" is subdivided into one or more index cells then it
  // is not contained, since index cells are subdivided only if they (nearly)
  // intersect a sufficient number of edges.  (But note that if "target" itself
  // is an index cell then it may be contained, since it could be a cell with
  // no edges in the loop interior.)
  if (relation != S2ShapeIndex::INDEXED) return false;

  // Otherwise check if any edges intersect "target".
  if (BoundaryApproxIntersects(it, target)) return false;

  // Otherwise check if the loop contains the center of "target".
  return Contains(it, target.GetCenter());
}